

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mem_stream.cpp
# Opt level: O0

void __thiscall
dpfb::streams::ConstMemStream::seek(ConstMemStream *this,int64_t offset,SeekOrigin origin)

{
  StreamError *this_00;
  size_t sStack_18;
  SeekOrigin origin_local;
  int64_t offset_local;
  ConstMemStream *this_local;
  
  sStack_18 = offset;
  if (origin != set) {
    if (origin == cur) {
      sStack_18 = this->pos + offset;
    }
    else if (origin == end) {
      sStack_18 = this->dataSize + offset;
    }
  }
  if (-1 < (long)sStack_18) {
    this->pos = sStack_18;
    return;
  }
  this_00 = (StreamError *)__cxa_allocate_exception(0x10);
  StreamError::runtime_error(this_00,"Offset points before the beginning");
  __cxa_throw(this_00,&StreamError::typeinfo,StreamError::~StreamError);
}

Assistant:

void ConstMemStream::seek(std::int64_t offset, SeekOrigin origin)
{
    switch (origin) {
        case SeekOrigin::set:
            break;
        case SeekOrigin::cur:
            offset += pos;
            break;
        case SeekOrigin::end:
            offset += dataSize;
            break;
    }

    if (offset < 0)
        throw StreamError("Offset points before the beginning");

    pos = offset;
}